

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateTypeSampledImage(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  DiagnosticStream *pDVar4;
  DiagnosticStream local_7c8;
  string local_5f0;
  DiagnosticStream local_5d0;
  DiagnosticStream local_3f8;
  undefined1 local_220 [8];
  ImageTypeInfo info;
  uint32_t image_type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  uVar2 = val::Instruction::word(inst,2);
  OVar3 = ValidationState_t::GetIdOpcode(_,uVar2);
  if (OVar3 == OpTypeImage) {
    ImageTypeInfo::ImageTypeInfo((ImageTypeInfo *)local_220);
    bVar1 = GetImageTypeInfo(_,uVar2,(ImageTypeInfo *)local_220);
    if (bVar1) {
      if ((info.arrayed == 0) || (info.arrayed == 1)) {
        uVar2 = ValidationState_t::version(_);
        if ((uVar2 < 0x10600) || (local_220._4_4_ != Buffer)) {
          __local._4_4_ = SPV_SUCCESS;
        }
        else {
          ValidationState_t::diag(&local_7c8,_,SPV_ERROR_INVALID_ID,inst);
          pDVar4 = DiagnosticStream::operator<<
                             (&local_7c8,
                              (char (*) [67])
                              "In SPIR-V 1.6 or later, sampled image dimension must not be Buffer");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream(&local_7c8);
        }
      }
      else {
        ValidationState_t::diag(&local_5d0,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_5f0,_,0x1231,(char *)0x0);
        pDVar4 = DiagnosticStream::operator<<(&local_5d0,&local_5f0);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [79])
                                   "Sampled image type requires an image type with \"Sampled\" operand set to 0 or 1"
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        std::__cxx11::string::~string((string *)&local_5f0);
        DiagnosticStream::~DiagnosticStream(&local_5d0);
      }
    }
    else {
      ValidationState_t::diag(&local_3f8,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_3f8,(char (*) [30])"Corrupt image type definition");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_3f8);
    }
  }
  else {
    ValidationState_t::diag((DiagnosticStream *)&info.format,_,SPV_ERROR_INVALID_DATA,inst);
    pDVar4 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&info.format,
                        (char (*) [41])"Expected Image to be of type OpTypeImage");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&info.format);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTypeSampledImage(ValidationState_t& _,
                                      const Instruction* inst) {
  const uint32_t image_type = inst->word(2);
  if (_.GetIdOpcode(image_type) != spv::Op::OpTypeImage) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image to be of type OpTypeImage";
  }

  ImageTypeInfo info;
  if (!GetImageTypeInfo(_, image_type, &info)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Corrupt image type definition";
  }
  // OpenCL requires Sampled=0, checked elsewhere.
  // Vulkan uses the Sampled=1 case.
  // If Dim is TileImageDataEXT, Sampled must be 2 and this is validated
  // elsewhere.
  if ((info.sampled != 0) && (info.sampled != 1)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << _.VkErrorID(4657)
           << "Sampled image type requires an image type with \"Sampled\" "
              "operand set to 0 or 1";
  }

  // This covers both OpTypeSampledImage and OpSampledImage.
  if (_.version() >= SPV_SPIRV_VERSION_WORD(1, 6) &&
      info.dim == spv::Dim::Buffer) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "In SPIR-V 1.6 or later, sampled image dimension must not be "
              "Buffer";
  }

  return SPV_SUCCESS;
}